

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leveldbutil.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  Env *env;
  uint uVar2;
  ulong uVar3;
  Status s;
  StdoutPrinter printer;
  string command;
  allocator<char> local_a5;
  undefined4 local_a4;
  void *local_a0;
  WritableFile local_98;
  string local_90;
  long *local_70 [2];
  long local_60 [6];
  
  env = leveldb::Env::Default();
  if (argc < 2) {
    main_cold_3();
    uVar2 = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,argv[1],(allocator<char> *)&local_90);
    iVar1 = std::__cxx11::string::compare((char *)local_70);
    if (iVar1 == 0) {
      local_98._vptr_WritableFile = (_func_int **)&PTR__WritableFile_001164c0;
      uVar2 = 0;
      if (argc != 2) {
        local_a4 = 0x116401;
        uVar3 = 0;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,argv[uVar3 + 2],&local_a5);
          leveldb::DumpFile((leveldb *)&local_a0,env,&local_90,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (local_a0 != (void *)0x0) {
            main_cold_2();
            local_a4 = 0;
          }
          if (local_a0 != (void *)0x0) {
            operator_delete__(local_a0);
          }
          uVar3 = uVar3 + 1;
        } while (argc - 2 != uVar3);
        uVar2 = (uint)(~(byte)local_a4 & 1);
      }
      leveldb::WritableFile::~WritableFile(&local_98);
    }
    else {
      main_cold_1();
      uVar2 = 1;
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  return uVar2;
}

Assistant:

int main(int argc, char** argv) {
  leveldb::Env* env = leveldb::Env::Default();
  bool ok = true;
  if (argc < 2) {
    Usage();
    ok = false;
  } else {
    std::string command = argv[1];
    if (command == "dump") {
      ok = leveldb::HandleDumpCommand(env, argv + 2, argc - 2);
    } else {
      Usage();
      ok = false;
    }
  }
  return (ok ? 0 : 1);
}